

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O3

bool Potassco::parseSigned(char **x,longlong *out,longlong sMin,longlong sMax)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  longlong lVar4;
  int *piVar5;
  bool bVar6;
  char *err;
  char *local_38;
  
  pcVar2 = *x;
  if ((pcVar2 == (char *)0x0) || (cVar1 = *pcVar2, cVar1 == '\0')) {
LAB_0011a6ee:
    bVar6 = false;
  }
  else {
    iVar3 = strncmp(pcVar2,"imax",4);
    lVar4 = sMax;
    if ((iVar3 == 0) || (iVar3 = strncmp(pcVar2,"imin",4), lVar4 = sMin, iVar3 == 0)) {
      *out = lVar4;
      *x = pcVar2 + 4;
    }
    else {
      if (cVar1 == '0') {
        iVar3 = 0x10;
        if (((byte)(pcVar2[1] | 0x20U) != 0x78) && (iVar3 = 8, (pcVar2[1] & 0xf8U) != 0x30))
        goto LAB_0011a64b;
      }
      else {
LAB_0011a64b:
        iVar3 = 10;
      }
      lVar4 = strtoll(pcVar2,&local_38,iVar3);
      *out = lVar4;
      if ((lVar4 + 0x8000000000000001U < 2) && (piVar5 = __errno_location(), *piVar5 == 0x22)) {
        *piVar5 = 0;
        pcVar2 = *x;
        if (*pcVar2 == '0') {
          iVar3 = 0x10;
          if (((byte)(pcVar2[1] | 0x20U) != 0x78) && (iVar3 = 8, (pcVar2[1] & 0xf8U) != 0x30))
          goto LAB_0011a6b2;
        }
        else {
LAB_0011a6b2:
          iVar3 = 10;
        }
        lVar4 = strtoll(pcVar2,(char **)0x0,iVar3);
        if (*piVar5 == 0x22) {
          return false;
        }
        if (*out != lVar4) {
          return false;
        }
      }
      if ((local_38 == *x) || (sMax < lVar4 || lVar4 < sMin)) goto LAB_0011a6ee;
      *x = local_38;
    }
    bVar6 = true;
  }
  return bVar6;
}

Assistant:

static bool parseSigned(const char*& x, long long& out, long long sMin, long long sMax) {
	if (!x || !*x) {
		return false;
	}
	if ((std::strncmp(x, "imax", 4) == 0 && (out = sMax) != 0) || (std::strncmp(x, "imin", 4) == 0 && (out = sMin) != 0)) {
		x += 4;
		return true;
	}
	char* err;
	out = strtoll(x, &err, detectBase(x));
	if ((out == LLONG_MAX || out == LLONG_MIN) && errno == ERANGE) {
		errno = 0;
		long long temp = strtoll(x, 0, detectBase(x));
		if (errno == ERANGE || out != temp) {
			return false;
		}
	}
	if (err == x || out < sMin || out > sMax) {
		return false;
	}
	x = err;
	return true;
}